

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O0

EStatusCode __thiscall PDFWriter::SetupState(PDFWriter *this,string *inStateFilePath)

{
  bool bVar1;
  Trace *this_00;
  PDFParser *pPVar2;
  ObjectIDType inObjectId;
  PDFObject *pPVar3;
  PDFDictionary *pPVar4;
  PDFBoolean *this_01;
  PDFInteger *this_02;
  longlong lVar5;
  PDFIndirectObjectReference *pPVar6;
  allocator<char> local_7a1;
  string local_7a0;
  undefined1 local_780 [8];
  PDFObjectCastPtr<PDFIndirectObjectReference> documentContextObject;
  string local_768;
  undefined1 local_748 [8];
  PDFObjectCastPtr<PDFIndirectObjectReference> objectsContextObject;
  string local_730;
  undefined1 local_710 [8];
  PDFObjectCastPtr<PDFInteger> isModifiedFileVersionObject;
  string local_6f8;
  undefined1 local_6d8 [8];
  PDFObjectCastPtr<PDFBoolean> isModifiedObject;
  PDFObjectCastPtr<PDFDictionary> pdfWriterDictionary;
  undefined1 local_6a8 [8];
  StateReader reader;
  EStatusCode status;
  string *inStateFilePath_local;
  PDFWriter *this_local;
  
  StateReader::StateReader((StateReader *)local_6a8);
  reader.mRootObject._4_4_ = StateReader::Start((StateReader *)local_6a8,inStateFilePath);
  if (reader.mRootObject._4_4_ == eSuccess) {
    pPVar2 = StateReader::GetObjectsReader((StateReader *)local_6a8);
    inObjectId = StateReader::GetRootObjectID((StateReader *)local_6a8);
    pPVar3 = PDFParser::ParseNewObject(pPVar2,inObjectId);
    PDFObjectCastPtr<PDFDictionary>::PDFObjectCastPtr
              ((PDFObjectCastPtr<PDFDictionary> *)
               &isModifiedObject.super_RefCountPtr<PDFBoolean>.mValue,pPVar3);
    pPVar4 = RefCountPtr<PDFDictionary>::operator->
                       ((RefCountPtr<PDFDictionary> *)
                        &isModifiedObject.super_RefCountPtr<PDFBoolean>.mValue);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6f8,"mIsModified",
               (allocator<char> *)
               ((long)&isModifiedFileVersionObject.super_RefCountPtr<PDFInteger>.mValue + 7));
    pPVar3 = PDFDictionary::QueryDirectObject(pPVar4,&local_6f8);
    PDFObjectCastPtr<PDFBoolean>::PDFObjectCastPtr((PDFObjectCastPtr<PDFBoolean> *)local_6d8,pPVar3)
    ;
    std::__cxx11::string::~string((string *)&local_6f8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&isModifiedFileVersionObject.super_RefCountPtr<PDFInteger>.mValue + 7));
    this_01 = RefCountPtr<PDFBoolean>::operator->((RefCountPtr<PDFBoolean> *)local_6d8);
    bVar1 = PDFBoolean::GetValue(this_01);
    this->mIsModified = bVar1;
    if ((this->mIsModified & 1U) != 0) {
      pPVar4 = RefCountPtr<PDFDictionary>::operator->
                         ((RefCountPtr<PDFDictionary> *)
                          &isModifiedObject.super_RefCountPtr<PDFBoolean>.mValue);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_730,"mModifiedFileVersion",
                 (allocator<char> *)
                 ((long)&objectsContextObject.super_RefCountPtr<PDFIndirectObjectReference>.mValue +
                 7));
      pPVar3 = PDFDictionary::QueryDirectObject(pPVar4,&local_730);
      PDFObjectCastPtr<PDFInteger>::PDFObjectCastPtr
                ((PDFObjectCastPtr<PDFInteger> *)local_710,pPVar3);
      std::__cxx11::string::~string((string *)&local_730);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&objectsContextObject.super_RefCountPtr<PDFIndirectObjectReference>.mValue +
                 7));
      this_02 = RefCountPtr<PDFInteger>::operator->((RefCountPtr<PDFInteger> *)local_710);
      lVar5 = PDFInteger::GetValue(this_02);
      this->mModifiedFileVersion = (EPDFVersion)lVar5;
      PDFObjectCastPtr<PDFInteger>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFInteger> *)local_710);
    }
    pPVar4 = RefCountPtr<PDFDictionary>::operator->
                       ((RefCountPtr<PDFDictionary> *)
                        &isModifiedObject.super_RefCountPtr<PDFBoolean>.mValue);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_768,"mObjectsContext",
               (allocator<char> *)
               ((long)&documentContextObject.super_RefCountPtr<PDFIndirectObjectReference>.mValue +
               7));
    pPVar3 = PDFDictionary::QueryDirectObject(pPVar4,&local_768);
    PDFObjectCastPtr<PDFIndirectObjectReference>::PDFObjectCastPtr
              ((PDFObjectCastPtr<PDFIndirectObjectReference> *)local_748,pPVar3);
    std::__cxx11::string::~string((string *)&local_768);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&documentContextObject.super_RefCountPtr<PDFIndirectObjectReference>.mValue +
               7));
    pPVar2 = StateReader::GetObjectsReader((StateReader *)local_6a8);
    pPVar6 = RefCountPtr<PDFIndirectObjectReference>::operator->
                       ((RefCountPtr<PDFIndirectObjectReference> *)local_748);
    reader.mRootObject._4_4_ =
         ObjectsContext::ReadState(&this->mObjectsContext,pPVar2,pPVar6->mObjectID);
    if (reader.mRootObject._4_4_ == eSuccess) {
      pPVar4 = RefCountPtr<PDFDictionary>::operator->
                         ((RefCountPtr<PDFDictionary> *)
                          &isModifiedObject.super_RefCountPtr<PDFBoolean>.mValue);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a0,"mDocumentContext",&local_7a1);
      pPVar3 = PDFDictionary::QueryDirectObject(pPVar4,&local_7a0);
      PDFObjectCastPtr<PDFIndirectObjectReference>::PDFObjectCastPtr
                ((PDFObjectCastPtr<PDFIndirectObjectReference> *)local_780,pPVar3);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::allocator<char>::~allocator(&local_7a1);
      pPVar2 = StateReader::GetObjectsReader((StateReader *)local_6a8);
      pPVar6 = RefCountPtr<PDFIndirectObjectReference>::operator->
                         ((RefCountPtr<PDFIndirectObjectReference> *)local_780);
      reader.mRootObject._4_4_ =
           PDFHummus::DocumentContext::ReadState(&this->mDocumentContext,pPVar2,pPVar6->mObjectID);
      if (reader.mRootObject._4_4_ == eSuccess) {
        StateReader::Finish((StateReader *)local_6a8);
      }
      PDFObjectCastPtr<PDFIndirectObjectReference>::~PDFObjectCastPtr
                ((PDFObjectCastPtr<PDFIndirectObjectReference> *)local_780);
    }
    PDFObjectCastPtr<PDFIndirectObjectReference>::~PDFObjectCastPtr
              ((PDFObjectCastPtr<PDFIndirectObjectReference> *)local_748);
    PDFObjectCastPtr<PDFBoolean>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFBoolean> *)local_6d8);
    PDFObjectCastPtr<PDFDictionary>::~PDFObjectCastPtr
              ((PDFObjectCastPtr<PDFDictionary> *)
               &isModifiedObject.super_RefCountPtr<PDFBoolean>.mValue);
  }
  else {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,"PDFWriter::SetupState, cant start state readering");
  }
  StateReader::~StateReader((StateReader *)local_6a8);
  return reader.mRootObject._4_4_;
}

Assistant:

EStatusCode PDFWriter::SetupState(const std::string& inStateFilePath)
{
	EStatusCode status;

	do
	{
		StateReader reader;

		status = reader.Start(inStateFilePath);
		if(status != eSuccess)
		{
			TRACE_LOG("PDFWriter::SetupState, cant start state readering");
			break;
		}

		PDFObjectCastPtr<PDFDictionary> pdfWriterDictionary(reader.GetObjectsReader()->ParseNewObject(reader.GetRootObjectID()));

        PDFObjectCastPtr<PDFBoolean> isModifiedObject(pdfWriterDictionary->QueryDirectObject("mIsModified"));
        mIsModified = isModifiedObject->GetValue();

        if(mIsModified)
        {
            PDFObjectCastPtr<PDFInteger> isModifiedFileVersionObject(pdfWriterDictionary->QueryDirectObject("mModifiedFileVersion"));
            mModifiedFileVersion = (EPDFVersion)(isModifiedFileVersionObject->GetValue());
        }

		PDFObjectCastPtr<PDFIndirectObjectReference> objectsContextObject(pdfWriterDictionary->QueryDirectObject("mObjectsContext"));
		status = mObjectsContext.ReadState(reader.GetObjectsReader(),objectsContextObject->mObjectID);
		if(status!= eSuccess)
			break;

		PDFObjectCastPtr<PDFIndirectObjectReference> documentContextObject(pdfWriterDictionary->QueryDirectObject("mDocumentContext"));
		status = mDocumentContext.ReadState(reader.GetObjectsReader(),documentContextObject->mObjectID);
		if(status!= eSuccess)
			break;

		reader.Finish();

	}while(false);

	return status;
}